

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool __thiscall mpt::array::set(array *this,reference<mpt::buffer> *a)

{
  content *pcVar1;
  long lVar2;
  bool bVar3;
  content *pcVar4;
  
  pcVar4 = *(content **)a;
  if ((pcVar4 == (content *)0x0) || (*(long *)(pcVar4 + 8) == 0)) {
    bVar3 = true;
    if (pcVar4 != (this->_buf)._ref) {
      if (pcVar4 == (content *)0x0) {
        pcVar4 = (content *)0x0;
      }
      else {
        lVar2 = (**(code **)(*(long *)pcVar4 + 0x10))(pcVar4);
        if (lVar2 == 0) {
          pcVar4 = (content *)0x0;
        }
      }
      pcVar1 = (this->_buf)._ref;
      if (pcVar1 != (content *)0x0) {
        (**(code **)(*(long *)pcVar1 + 8))();
      }
      (this->_buf)._ref = pcVar4;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool array::set(const reference<buffer> &a)
{
	buffer *b;
	if ((b = a.instance()) && b->content_traits()) {
		return false;
	}
	_buf = reinterpret_cast<const reference<content> &>(a);
	return true;
}